

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtls_test.cpp
# Opt level: O0

void __thiscall
ot::commissioner::DtlsTest_MbedtlsClientServer_Test::DtlsTest_MbedtlsClientServer_Test
          (DtlsTest_MbedtlsClientServer_Test *this)

{
  DtlsTest_MbedtlsClientServer_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__DtlsTest_MbedtlsClientServer_Test_003ed2f8;
  return;
}

Assistant:

TEST(DtlsTest, MbedtlsClientServer)
{
    const ByteArray kHello{'h', 'e', 'l', 'l', 'o'};

    DtlsConfig config;

    // Setup dtls server
    config.mCaChain = ByteArray{kServerTrustAnchor.begin(), kServerTrustAnchor.end()};
    config.mOwnCert = ByteArray{kServerCert.begin(), kServerCert.end()};
    config.mOwnKey  = ByteArray{kServerKey.begin(), kServerKey.end()};

    config.mCaChain.push_back(0);
    config.mOwnCert.push_back(0);
    config.mOwnKey.push_back(0);

    auto eventBase = event_base_new();
    ASSERT_NE(eventBase, nullptr);

    auto serverSocket = std::make_shared<UdpSocket>(eventBase);
    EXPECT_EQ(serverSocket->Bind(kServerAddr, kServerPort), 0);

    DtlsSession dtlsServer{eventBase, true, serverSocket};
    EXPECT_EQ(dtlsServer.Init(config), ErrorCode::kNone);

    dtlsServer.SetReceiver([&kHello, eventBase](Endpoint &, const ByteArray &aBuf) {
        EXPECT_EQ(aBuf, kHello);

        event_base_loopbreak(eventBase);
    });

    auto serverConnected = [](const DtlsSession &aSession, Error aError) {
        EXPECT_EQ(aError, ErrorCode::kNone);
        EXPECT_EQ(aSession.GetState(), DtlsSession::State::kConnected);
    };
    dtlsServer.Connect(serverConnected);

    // Setup dtls client
    config.mCaChain = ByteArray{kClientTrustAnchor.begin(), kClientTrustAnchor.end()};
    config.mOwnCert = ByteArray{kClientCert.begin(), kClientCert.end()};
    config.mOwnKey  = ByteArray{kClientKey.begin(), kClientKey.end()};

    config.mCaChain.push_back(0);
    config.mOwnCert.push_back(0);
    config.mOwnKey.push_back(0);

    auto clientSocket = std::make_shared<UdpSocket>(eventBase);
    EXPECT_EQ(clientSocket->Connect(kServerAddr, kServerPort), 0);

    DtlsSession dtlsClient{eventBase, false, clientSocket};
    EXPECT_EQ(dtlsClient.Init(config), ErrorCode::kNone);

    auto clientConnected = [&kHello](DtlsSession &aSession, Error aError) {
        EXPECT_EQ(aError, ErrorCode::kNone);
        EXPECT_EQ(aSession.GetState(), DtlsSession::State::kConnected);
        EXPECT_EQ(aSession.Send(kHello, MessageSubType::kNone), ErrorCode::kNone);
    };
    dtlsClient.Connect(clientConnected);

    int fail = event_base_loop(eventBase, EVLOOP_NO_EXIT_ON_EMPTY);
    ASSERT_EQ(fail, 0);
    event_base_free(eventBase);
}